

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Layer_*> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int count;
  ON_Object *p;
  ON_Layer *layer;
  int local_3c;
  ON_Object *local_38;
  ON_Layer *local_30;
  
  if (a->m_a != (ON_Layer **)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 3);
  }
  a->m_count = 0;
  bVar1 = ReadInt(this,&local_3c);
  iVar3 = 0;
  if (bVar1) {
    ON_SimpleArray<ON_Layer_*>::SetCapacity(a,(long)local_3c);
    for (; iVar3 < local_3c; iVar3 = iVar3 + 1) {
      local_30 = (ON_Layer *)0x0;
      local_38 = (ON_Object *)0x0;
      iVar2 = ReadObject(this,&local_38);
      if (iVar2 != 1) {
LAB_003c5edb:
        if (local_38 != (ON_Object *)0x0) {
          (*local_38->_vptr_ON_Object[4])();
        }
        iVar3 = 0;
        goto LAB_003c5ef2;
      }
      local_30 = ON_Layer::Cast(local_38);
      if (local_30 == (ON_Layer *)0x0) goto LAB_003c5edb;
      ON_SimpleArray<ON_Layer_*>::Append(a,&local_30);
    }
    iVar3 = 1;
  }
LAB_003c5ef2:
  return SUB41(iVar3,0);
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<class ON_Layer*>& a)
{
  a.Empty();
  ON_Layer* layer;
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      layer = 0;
      ON_Object* p = 0;
      rc = (1==ReadObject(&p));
      if (rc)
      {
        layer = ON_Layer::Cast(p);
      }
      if (!rc || 0 == layer)
      {
        if ( p )
          delete p;
        rc = false;
        break;
      }
      a.Append(layer);
    }
  }
  return rc;
}